

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O3

rotations_t *
opengv::relative_pose::sixpt
          (rotations_t *__return_storage_ptr__,RelativeAdapterBase *adapter,Indices *indices)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  rotations_t *prVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  size_t sVar12;
  long lVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  Matrix<double,_6,_6,_0,_6,_6> L2;
  Matrix<double,_6,_6,_0,_6,_6> L1;
  double local_340;
  double local_338;
  double local_330;
  double local_328;
  double local_320;
  double dStack_318;
  double local_310;
  undefined1 local_308 [16];
  double local_2f8;
  undefined1 local_2f0 [16];
  double local_2e0;
  undefined1 local_2d0 [16];
  rotations_t *local_2c0;
  double local_2b8;
  undefined1 local_2b0 [16];
  Matrix<double,_6,_6,_0,_6,_6> local_2a0;
  Matrix<double,_6,_6,_0,_6,_6> local_180;
  
  local_2b8 = (double)indices->_numberCorrespondences;
  local_2c0 = __return_storage_ptr__;
  if (local_2b8 != 0.0) {
    lVar13 = 0x28;
    lVar10 = 0;
    sVar12 = 0;
    do {
      iVar11 = (int)sVar12;
      lVar9 = lVar10 >> 0x1e;
      iVar8 = iVar11;
      if (indices->_useIndices != false) {
        iVar8 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                               _M_impl.super__Vector_impl_data._M_start + lVar9);
      }
      (*adapter->_vptr_RelativeAdapterBase[6])(&local_320,adapter,(long)iVar8);
      iVar8 = iVar11;
      if (indices->_useIndices != false) {
        iVar8 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                               _M_impl.super__Vector_impl_data._M_start + lVar9);
      }
      (*adapter->_vptr_RelativeAdapterBase[2])(&local_340,adapter,(long)iVar8);
      auVar3._8_8_ = dStack_318;
      auVar3._0_8_ = local_320;
      auVar14._8_8_ = local_340;
      auVar14._0_8_ = local_340;
      auVar14 = vmulpd_avx512vl(auVar3,auVar14);
      auVar2._8_8_ = local_338;
      auVar2._0_8_ = local_338;
      auVar14 = vfmadd132pd_avx512vl(local_308,auVar14,auVar2);
      auVar15._8_8_ = local_330;
      auVar15._0_8_ = local_330;
      local_2b0 = vfmadd231pd_fma(auVar14,auVar15,local_2f0);
      local_328 = local_330 * local_2e0;
      dVar1 = local_310 * local_340;
      local_2d0._0_8_ = local_2f8 * local_338;
      iVar8 = iVar11;
      if (indices->_useIndices != false) {
        iVar8 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                               _M_impl.super__Vector_impl_data._M_start + lVar9);
      }
      (*adapter->_vptr_RelativeAdapterBase[8])(&local_320,adapter,(long)iVar8);
      iVar8 = iVar11;
      if (indices->_useIndices != false) {
        iVar8 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                               _M_impl.super__Vector_impl_data._M_start + lVar9);
      }
      dVar1 = local_328 + (double)local_2d0._0_8_ + dVar1;
      (*adapter->_vptr_RelativeAdapterBase[3])(&local_340,adapter,(long)iVar8);
      auVar6._8_8_ = dStack_318;
      auVar6._0_8_ = local_320;
      auVar4._8_8_ = local_340;
      auVar4._0_8_ = local_340;
      auVar14 = vmulpd_avx512vl(auVar6,auVar4);
      auVar5._8_8_ = local_338;
      auVar5._0_8_ = local_338;
      auVar14 = vfmadd132pd_avx512vl(local_308,auVar14,auVar5);
      auVar16._8_8_ = local_330;
      auVar16._0_8_ = local_330;
      local_2d0 = vfmadd231pd_fma(auVar14,auVar16,local_2f0);
      *(undefined8 *)
       ((long)local_180.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array + lVar13 + -0x28) = local_2b0._0_8_;
      *(undefined8 *)
       ((long)local_180.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array + lVar13 + -0x20) = local_2b0._8_8_;
      *(undefined1 (*) [16])(local_2d0 + lVar13 + 8) = local_2d0;
      local_328 = local_310 * local_340 + local_2f8 * local_338 + local_330 * local_2e0;
      *(double *)(local_2b0 + lVar13 + -8) = local_328;
      *(double *)
       ((long)local_180.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array + lVar13 + -0x18) = dVar1;
      iVar8 = iVar11;
      if (indices->_useIndices != false) {
        iVar8 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                               _M_impl.super__Vector_impl_data._M_start + lVar9);
      }
      (*adapter->_vptr_RelativeAdapterBase[5])(&local_320,adapter,(long)iVar8);
      auVar25._8_8_ = 0;
      auVar25._0_8_ = dStack_318;
      auVar29._8_8_ = 0;
      auVar29._0_8_ = dVar1;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = local_310;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = local_320;
      auVar14 = vshufpd_avx(local_2b0,local_2b0,1);
      auVar27._8_8_ = 0;
      auVar27._0_8_ = dStack_318 * dVar1;
      auVar2 = vfmsub231sd_fma(auVar27,auVar14,auVar19);
      auVar20._8_8_ = 0;
      auVar20._0_8_ = local_310 * local_2b0._0_8_;
      auVar3 = vfmsub231sd_fma(auVar20,auVar23,auVar29);
      auVar17._8_8_ = 0;
      auVar17._0_8_ = local_320 * auVar14._0_8_;
      auVar15 = vfmsub231sd_fma(auVar17,local_2b0,auVar25);
      auVar14 = vunpcklpd_avx(auVar2,auVar3);
      *(undefined1 (*) [16])
       ((long)local_180.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array + lVar13 + -0x10) = auVar14;
      *(long *)((long)local_180.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                      m_storage.m_data.array + lVar13) = auVar15._0_8_;
      if (indices->_useIndices != false) {
        iVar11 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_start + lVar9);
      }
      (*adapter->_vptr_RelativeAdapterBase[7])(&local_320,adapter,(long)iVar11);
      auVar26._8_8_ = 0;
      auVar26._0_8_ = dStack_318;
      auVar30._8_8_ = 0;
      auVar30._0_8_ = local_328;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = local_310;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = local_320;
      sVar12 = sVar12 + 1;
      lVar10 = lVar10 + 0x100000000;
      auVar14 = vshufpd_avx(local_2d0,local_2d0,1);
      auVar28._8_8_ = 0;
      auVar28._0_8_ = dStack_318 * local_328;
      auVar2 = vfmsub231sd_fma(auVar28,auVar14,auVar21);
      auVar22._8_8_ = 0;
      auVar22._0_8_ = local_310 * local_2d0._0_8_;
      auVar3 = vfmsub231sd_fma(auVar22,auVar24,auVar30);
      auVar18._8_8_ = 0;
      auVar18._0_8_ = local_320 * auVar14._0_8_;
      auVar15 = vfmsub231sd_fma(auVar18,local_2d0,auVar26);
      auVar14 = vunpcklpd_avx(auVar2,auVar3);
      *(undefined1 (*) [16])(local_2b0 + lVar13) = auVar14;
      *(long *)((long)local_2a0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                      m_storage.m_data.array + lVar13) = auVar15._0_8_;
      lVar13 = lVar13 + 0x30;
    } while (local_2b8 != (double)sVar12);
  }
  prVar7 = local_2c0;
  (local_2c0->
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_2c0->
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_2c0->
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  modules::sixpt_main(&local_180,&local_2a0,local_2c0);
  return prVar7;
}

Assistant:

rotations_t sixpt(
    const RelativeAdapterBase & adapter,
    const Indices & indices )
{
  size_t numberCorrespondences = indices.size();
  assert(numberCorrespondences == 6);

  Eigen::Matrix<double,6,6> L1;
  Eigen::Matrix<double,6,6> L2;

  for(size_t i = 0; i < numberCorrespondences; i++)
  {
    bearingVector_t f1 =
        adapter.getCamRotation1(indices[i]) * adapter.getBearingVector1(indices[i]);
    bearingVector_t f2 =
        adapter.getCamRotation2(indices[i]) * adapter.getBearingVector2(indices[i]);
        
    L1.block<3,1>(0,i) = f1;
    L2.block<3,1>(0,i) = f2;
    
    L1.block<3,1>(3,i) = f1.cross(adapter.getCamOffset1(indices[i]));
    L2.block<3,1>(3,i) = f2.cross(adapter.getCamOffset2(indices[i]));
  }

  rotations_t solutions;
  modules::sixpt_main( L1, L2, solutions );  
  return solutions;
}